

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrentappend.cpp
# Opt level: O2

void insert_random_elements(DuckDB *db,bool *correct,int threadnr)

{
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> _Var1;
  char cVar2;
  pointer pMVar3;
  long lVar4;
  long lVar5;
  allocator local_109;
  MaterializedQueryResult *local_108;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_100;
  long *local_f8;
  long *local_f0;
  long *local_e8;
  long local_e0;
  bool *local_d8;
  Connection con;
  Value count;
  Value new_count;
  
  local_e0 = (long)threadnr;
  correct[local_e0] = true;
  local_d8 = correct;
  duckdb::Connection::Connection(&con,db);
  std::__cxx11::string::string((string *)&count,"BEGIN TRANSACTION;",(allocator *)&new_count);
  duckdb::Connection::Query((string *)&local_e8);
  if (local_e8 != (long *)0x0) {
    (**(code **)(*local_e8 + 8))();
  }
  local_e8 = (long *)0x0;
  std::__cxx11::string::~string((string *)&count);
  std::__cxx11::string::string
            ((string *)&count,"SELECT COUNT(*) FROM integers",(allocator *)&new_count);
  duckdb::Connection::Query((string *)&local_100);
  std::__cxx11::string::~string((string *)&count);
  pMVar3 = duckdb::
           unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
           ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)&local_100);
  duckdb::MaterializedQueryResult::GetValue((ulong)&count,(ulong)pMVar3);
  lVar4 = duckdb::Value::GetValue<long>();
  for (lVar5 = 1; lVar5 != 0x3e9; lVar5 = lVar5 + 1) {
    std::__cxx11::string::string
              ((string *)&new_count,"INSERT INTO integers VALUES (3)",(allocator *)&local_108);
    duckdb::Connection::Query((string *)&local_f0);
    if (local_f0 != (long *)0x0) {
      (**(code **)(*local_f0 + 8))();
    }
    local_f0 = (long *)0x0;
    std::__cxx11::string::~string((string *)&new_count);
    std::__cxx11::string::string((string *)&new_count,"SELECT COUNT(*) FROM integers",&local_109);
    duckdb::Connection::Query((string *)&local_108);
    _Var1._M_head_impl = local_100._M_head_impl;
    local_100._M_head_impl = local_108;
    local_108 = (MaterializedQueryResult *)0x0;
    if (_Var1._M_head_impl != (MaterializedQueryResult *)0x0) {
      (**(code **)(*(long *)_Var1._M_head_impl + 8))();
      if (local_108 != (MaterializedQueryResult *)0x0) {
        (**(code **)(*(long *)local_108 + 8))();
      }
    }
    local_108 = (MaterializedQueryResult *)0x0;
    std::__cxx11::string::~string((string *)&new_count);
    pMVar3 = duckdb::
             unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
             ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                           *)&local_100);
    duckdb::MaterializedQueryResult::GetValue((ulong)&new_count,(ulong)pMVar3);
    local_108 = (MaterializedQueryResult *)(lVar4 + lVar5);
    cVar2 = duckdb::Value::operator!=(&new_count,(long *)&local_108);
    if (cVar2 != '\0') {
      local_d8[local_e0] = false;
    }
    duckdb::Value::operator=(&count,&new_count);
    duckdb::Value::~Value(&new_count);
  }
  LOCK();
  append_finished_threads.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)append_finished_threads.super___atomic_base<int>._M_i + 1);
  UNLOCK();
  do {
  } while (append_finished_threads.super___atomic_base<int>._M_i != 10);
  std::__cxx11::string::string((string *)&new_count,"COMMIT;",(allocator *)&local_108);
  duckdb::Connection::Query((string *)&local_f8);
  if (local_f8 != (long *)0x0) {
    (**(code **)(*local_f8 + 8))();
  }
  local_f8 = (long *)0x0;
  std::__cxx11::string::~string((string *)&new_count);
  duckdb::Value::~Value(&count);
  if (local_100._M_head_impl != (MaterializedQueryResult *)0x0) {
    (**(code **)(*(long *)local_100._M_head_impl + 8))();
  }
  duckdb::Connection::~Connection(&con);
  return;
}

Assistant:

static void insert_random_elements(DuckDB *db, bool *correct, int threadnr) {
	correct[threadnr] = true;
	Connection con(*db);
	// initial count
	con.Query("BEGIN TRANSACTION;");
	auto result = con.Query("SELECT COUNT(*) FROM integers");
	Value count = result->GetValue(0, 0);
	auto start_count = count.GetValue<int64_t>();
	for (size_t i = 0; i < CONCURRENT_APPEND_INSERT_ELEMENTS; i++) {
		// count should increase by one for every append we do
		con.Query("INSERT INTO integers VALUES (3)");
		result = con.Query("SELECT COUNT(*) FROM integers");
		Value new_count = result->GetValue(0, 0);
		if (new_count != start_count + i + 1) {
			correct[threadnr] = false;
		}
		count = new_count;
	}
	append_finished_threads++;
	while (append_finished_threads != CONCURRENT_APPEND_THREAD_COUNT)
		;
	con.Query("COMMIT;");
}